

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# devices.cpp
# Opt level: O0

void __thiscall CDevice::CheckPage(CDevice *this,ECheckPageLevel level)

{
  ESlotOptions EVar1;
  CDeviceSlot *pCVar2;
  CDeviceSlot *pCVar3;
  int iVar4;
  int iVar5;
  int local_84;
  int nextPageN;
  CDeviceSlot *prevS;
  CDeviceSlot *S;
  int i;
  int realAddr;
  char buf [64];
  ECheckPageLevel level_local;
  CDevice *this_local;
  
  buf._60_4_ = level;
  if (((PseudoORG != DISP_NONE) && (level != CHECK_NO_EMIT)) && (0xffff < CurAddress)) {
    if (pass == 3) {
      snprintf((char *)&i,0x40,"RAM limit exceeded 0x%X by DISP",(ulong)(uint)CurAddress);
      Warning((char *)&i,(char *)0x0,W_PASS3);
    }
    CurAddress = CurAddress & 0xffff;
  }
  if (PseudoORG == DISP_NONE) {
    local_84 = CurAddress;
  }
  else {
    local_84 = adrdisp;
  }
  if (((buf._60_4_ == 0) || (local_84 < this->Slots[this->previousSlotI]->Address)) ||
     (this->Slots[this->previousSlotI]->Address + this->Slots[this->previousSlotI]->Size <= local_84
     )) {
    S._0_4_ = this->SlotsCount;
    do {
      iVar4 = (int)S + -1;
      if ((int)S == 0) {
        Error("CheckPage(..): please, contact the author of this program.",(char *)0x0,FATAL);
        return;
      }
      pCVar2 = this->Slots[iVar4];
      S._0_4_ = iVar4;
    } while (local_84 < pCVar2->Address);
    Page = pCVar2->Page;
    MemoryPointer = Page->RAM + (local_84 - pCVar2->Address);
    if (buf._60_4_ == 0) {
      this->previousSlotOpt = pCVar2->Option;
      this->previousSlotI = iVar4;
      this->limitExceeded = false;
    }
    else if ((iVar4 != this->previousSlotI) || (pCVar2->Address + pCVar2->Size <= local_84)) {
      if (pCVar2->Address + pCVar2->Size <= local_84) {
        MemoryPointer = (byte *)0x0;
      }
      EVar1 = this->previousSlotOpt;
      if (EVar1 == O_ERROR) {
        if (((pass == 3) && (buf._60_4_ == 2)) && ((this->limitExceeded & 1U) == 0)) {
          ErrorInt("Write outside of memory slot",local_84,SUPPRESS);
          this->limitExceeded = true;
        }
      }
      else if (EVar1 == O_WARNING) {
        if (((pass == 3) && (buf._60_4_ == 2)) && ((this->limitExceeded & 1U) == 0)) {
          Warning("Write outside of memory slot",(char *)0x0,W_PASS3);
          this->limitExceeded = true;
        }
      }
      else if (EVar1 == O_NEXT) {
        pCVar3 = this->Slots[this->previousSlotI];
        iVar5 = pCVar3->Page->Number + 1;
        if (iVar5 < this->PagesCount) {
          if (local_84 == pCVar3->Address + pCVar3->Size) {
            pCVar3->Page = this->Pages[iVar5];
            if (PseudoORG == DISP_NONE) {
              CurAddress = CurAddress - pCVar3->Size;
            }
            else {
              adrdisp = adrdisp - pCVar3->Size;
            }
            Page = pCVar3->Page;
            MemoryPointer = pCVar3->Page->RAM;
            return;
          }
          ErrorInt("Write beyond memory slot in wrap-around slot catched too late by",
                   (local_84 - pCVar3->Address) - pCVar3->Size,FATAL);
        }
        else {
          ErrorInt("No more memory pages to map next one into slot",this->previousSlotI,SUPPRESS);
          pCVar3->Option = O_NONE;
          this->limitExceeded = false;
          this->previousSlotI = iVar4;
          this->previousSlotOpt = pCVar2->Option;
        }
      }
      else if (((pass == 3) && (buf._60_4_ == 2)) &&
              (((this->limitExceeded & 1U) == 0 && (MemoryPointer == (byte *)0x0)))) {
        ErrorInt("Write outside of device memory at",local_84,SUPPRESS);
        this->limitExceeded = true;
      }
      if (buf._60_4_ == 2) {
        this->limitExceeded = (this->limitExceeded & 1U & this->previousSlotI == iVar4) != 0;
        this->previousSlotI = iVar4;
        this->previousSlotOpt = pCVar2->Option;
      }
    }
  }
  return;
}

Assistant:

void CDevice::CheckPage(const ECheckPageLevel level) {
	// fake DISP address gets auto-wrapped FFFF->0 (with warning only)
	// only with "emit" mode, labels may get the value 0x10000 before the address gets truncated
	if (DISP_NONE != PseudoORG && CHECK_NO_EMIT != level && 0x10000 <= CurAddress) {
		if (LASTPASS == pass) {
			char buf[64];
			SPRINTF1(buf, 64, "RAM limit exceeded 0x%X by DISP", (unsigned int)CurAddress);
			Warning(buf);
		}
		CurAddress &= 0xFFFF;
	}
	// check the emit address for bytecode
	const int realAddr = DISP_NONE != PseudoORG ? adrdisp : CurAddress;
	// quicker check to avoid scanning whole slots array every byte
	if (CHECK_RESET != level
		&& Slots[previousSlotI]->Address <= realAddr
		&& realAddr < Slots[previousSlotI]->Address + Slots[previousSlotI]->Size) return;
	for (int i=SlotsCount; i--; ) {
		CDeviceSlot* const S = Slots[i];
		if (realAddr < S->Address) continue;
		Page = S->Page;
		MemoryPointer = Page->RAM + (realAddr - S->Address);
 		if (CHECK_RESET == level) {
			previousSlotOpt = S->Option;
			previousSlotI = i;
			limitExceeded = false;
			return;
		}
		// if still in the same slot and within boundaries, we are done
		if (i == previousSlotI && realAddr < S->Address + S->Size) return;
		// crossing into other slot, check options for special functionality of old slot
		if (S->Address + S->Size <= realAddr) MemoryPointer = nullptr; // you're not writing there
		switch (previousSlotOpt) {
			case CDeviceSlot::O_ERROR:
				if (LASTPASS == pass && CHECK_EMIT == level && !limitExceeded) {
					ErrorInt("Write outside of memory slot", realAddr, SUPPRESS);
					limitExceeded = true;
				}
				break;
			case CDeviceSlot::O_WARNING:
				if (LASTPASS == pass && CHECK_EMIT == level && !limitExceeded) {
					Warning("Write outside of memory slot");
					limitExceeded = true;
				}
				break;
			case CDeviceSlot::O_NEXT:
			{
				CDeviceSlot* const prevS = Slots[previousSlotI];
				const int nextPageN = prevS->Page->Number + 1;
				if (PagesCount <= nextPageN) {
					ErrorInt("No more memory pages to map next one into slot", previousSlotI, SUPPRESS);
					// disable the option on the overflowing slot
					prevS->Option = CDeviceSlot::O_NONE;
					// reset error reporting even when level is CHECK_NO_EMIT, one error is enough
					limitExceeded = false;
					previousSlotI = i;
					previousSlotOpt = S->Option;
					break;		// continue into next slot, don't wrap any more
				}
				if (realAddr != (prevS->Address + prevS->Size)) {	// should be equal
					ErrorInt("Write beyond memory slot in wrap-around slot catched too late by",
								realAddr - prevS->Address - prevS->Size, FATAL);
					break;
				}
				prevS->Page = Pages[nextPageN];		// map next page into the guarded slot
				Page = prevS->Page;
				if (DISP_NONE != PseudoORG) adrdisp -= prevS->Size;
				else CurAddress -= prevS->Size;
				MemoryPointer = Page->RAM;
				return;		// preserve current option status
			}
			default:
				if (LASTPASS == pass && CHECK_EMIT == level && !limitExceeded && !MemoryPointer) {
					ErrorInt("Write outside of device memory at", realAddr, SUPPRESS);
					limitExceeded = true;
				}
				break;
		}
		// refresh check slot settings (only in CHECK_EMIT case, otherwise ParseLine will reset it with CHECK_NO_EMIT at BoL!)
		if (CHECK_EMIT == level) {
			limitExceeded &= (previousSlotI == i);	// reset limit flag if slot changed (in non check_reset mode)
			previousSlotI = i;
			previousSlotOpt = S->Option;
		}
		return;
	}
	Error("CheckPage(..): please, contact the author of this program.", nullptr, FATAL);
}